

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

void __thiscall
LargeGapGrayCode::createCodeFromTheorem1(LargeGapGrayCode *this,int n,int m,int s,int t)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  LargeGapGrayCode *this_00;
  double dVar3;
  stringstream local_228 [8];
  stringstream ss;
  ostream local_218 [112];
  ios_base local_1a8 [264];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  vector<char,_std::allocator<char>_> P;
  vector<char,_std::allocator<char>_> Z;
  vector<int,_std::allocator<int>_> t_1;
  
  this_00 = (LargeGapGrayCode *)CONCAT44(in_register_00000034,n);
  if (((0 < m && m <= n) && ((s & 1U) != 0 && 0 < s)) && ((t & 1U) != 0 && 0 < t)) {
    dVar3 = ldexp(1.0,m);
    if (((dVar3 == (double)(t + s)) && (!NAN(dVar3) && !NAN((double)(t + s)))) && (m + n < 0x15)) {
      createPVector((vector<char,_std::allocator<char>_> *)local_80,this_00,s,t);
      dVar3 = ldexp(1.0,n);
      multiCopyVector((vector<char,_std::allocator<char>_> *)
                      &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,this_00,
                      (vector<char,_std::allocator<char>_> *)local_80,(int)dVar3);
      createTransitionSequenceTheorem1
                ((vector<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,this,n,m,
                 (vector<char,_std::allocator<char>_> *)
                 &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      iVar1 = m + n + -1;
      std::vector<int,_std::allocator<int>_>::operator=
                ((this->m_transitionSequences).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar1,
                 (vector<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::__cxx11::stringstream::stringstream(local_228);
      std::__ostream_insert<char,std::char_traits<char>>(local_218,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<(local_218,n);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," + ",3);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,m);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((this->m_creationMethod).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar1),(string *)local_a0);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0]);
      }
      std::__cxx11::stringstream::~stringstream(local_228);
      std::ios_base::~ios_base(local_1a8);
      if (Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(P.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (local_80 != (undefined1  [8])0x0) {
        operator_delete((void *)local_80);
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Constraints for Theorem 1 are not satisfied.",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void LargeGapGrayCode::createCodeFromTheorem1(int n, int m, int s, int t)
{
	if(n >= m && m >= 1 && isOddPositive(s) && isOddPositive(t) && (s+t) == pow(2,m) && (n+m <= maxBitWidth)) {
		std::vector<char> P = createPVector(s, t);
		std::vector<char> Z = multiCopyVector(P, pow(2, n));
		std::vector<int> t = createTransitionSequenceTheorem1(n, m, Z);
		m_transitionSequences[n+m-1] = t;
		std::stringstream ss;
		ss << "(" << n << " + " << m << ")";
		m_creationMethod[n+m-1] = ss.str();
	}
	else {
		std::cout << "Constraints for Theorem 1 are not satisfied." << std::endl;
	}
}